

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

BrotliDecoderErrorCode
duckdb_brotli::DecodeVarLenUint8(BrotliDecoderStateInternal *s,BrotliBitReader *br,uint64_t *value)

{
  BrotliRunningDecodeUint8State BVar1;
  byte *pbVar2;
  ulong uVar3;
  BrotliDecoderErrorCode BVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  
  BVar1 = s->substate_decode_uint8;
  BVar4 = BROTLI_DECODER_NEEDS_MORE_INPUT;
  if (BVar1 == BROTLI_STATE_DECODE_UINT8_NONE) {
    uVar7 = br->bit_pos_;
    while (uVar7 == 0) {
      pbVar2 = br->next_in;
      if (pbVar2 == br->last_in) {
        return BVar4;
      }
      br->val_ = br->val_ | (ulong)*pbVar2;
      br->bit_pos_ = 8;
      br->next_in = pbVar2 + 1;
      uVar7 = 8;
    }
    uVar5 = br->val_;
    uVar6 = uVar7 - 1;
    br->bit_pos_ = uVar6;
    br->val_ = uVar5 >> 1;
    if ((uVar5 & 1) == 0) {
      *value = 0;
      return BROTLI_DECODER_SUCCESS;
    }
  }
  else {
    if (BVar1 != BROTLI_STATE_DECODE_UINT8_SHORT) {
      if (BVar1 != BROTLI_STATE_DECODE_UINT8_LONG) {
        return BROTLI_DECODER_ERROR_UNREACHABLE;
      }
      uVar7 = *value;
      goto LAB_00367837;
    }
    uVar6 = br->bit_pos_;
  }
  uVar5 = uVar6;
  while (uVar5 < 3) {
    pbVar2 = br->next_in;
    if (pbVar2 == br->last_in) {
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
      return BVar4;
    }
    br->val_ = br->val_ | (ulong)*pbVar2 << ((byte)uVar5 & 0x3f);
    br->bit_pos_ = uVar6 | 8;
    br->next_in = pbVar2 + 1;
    uVar5 = uVar6 | 8;
  }
  uVar6 = br->val_;
  br->bit_pos_ = uVar5 - 3;
  br->val_ = uVar6 >> 3;
  uVar7 = uVar6 & 7;
  if (uVar7 == 0) {
    *value = 1;
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
    return BROTLI_DECODER_SUCCESS;
  }
  *value = uVar7;
LAB_00367837:
  uVar6 = br->bit_pos_;
  while( true ) {
    if (uVar7 <= uVar6) {
      uVar5 = br->val_;
      uVar3 = *(ulong *)(kBrotliBitMask + uVar7 * 8);
      br->bit_pos_ = uVar6 - uVar7;
      br->val_ = uVar5 >> ((byte)uVar7 & 0x3f);
      *value = (ulong)(uint)(1 << ((byte)*value & 0x1f)) + (uVar3 & uVar5);
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
      return BROTLI_DECODER_SUCCESS;
    }
    pbVar2 = br->next_in;
    if (pbVar2 == br->last_in) break;
    br->val_ = br->val_ | (ulong)*pbVar2 << ((byte)uVar6 & 0x3f);
    uVar6 = uVar6 + 8;
    br->bit_pos_ = uVar6;
    br->next_in = pbVar2 + 1;
  }
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
  return BVar4;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderErrorCode DecodeVarLenUint8(BrotliDecoderState *s, BrotliBitReader *br,
                                                                brotli_reg_t *value) {
	brotli_reg_t bits;
	switch (s->substate_decode_uint8) {
	case BROTLI_STATE_DECODE_UINT8_NONE:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 1, &bits))) {
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits == 0) {
			*value = 0;
			return BROTLI_DECODER_SUCCESS;
		}
		/* Fall through. */

	case BROTLI_STATE_DECODE_UINT8_SHORT:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 3, &bits))) {
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits == 0) {
			*value = 1;
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
			return BROTLI_DECODER_SUCCESS;
		}
		/* Use output value as a temporary storage. It MUST be persisted. */
		*value = bits;
		/* Fall through. */

	case BROTLI_STATE_DECODE_UINT8_LONG:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, *value, &bits))) {
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		*value = (1U << *value) + bits;
		s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
		return BROTLI_DECODER_SUCCESS;

	default:
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
	}
}